

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

int __thiscall
FOptionMenuTextField::Draw
          (FOptionMenuTextField *this,FOptionMenuDescriptor *desc,int y,int indent,bool selected)

{
  int iVar1;
  int iVar2;
  int newindent;
  int tlen;
  FString text;
  int local_20;
  bool selected_local;
  int indent_local;
  int y_local;
  FOptionMenuDescriptor *desc_local;
  FOptionMenuTextField *this_local;
  
  text.Chars._7_1_ = selected;
  local_20 = indent;
  if ((this->mEntering & 1U) != 0) {
    (*(this->super_FOptionMenuFieldBase).super_FOptionMenuItem.super_FListMenuItem.
      _vptr_FListMenuItem[0x13])();
    iVar1 = FFont::StringWidth(SmallFont,(FString *)&stack0xffffffffffffffd0);
    iVar1 = iVar1 * CleanXfac_1;
    iVar2 = DCanvas::GetWidth((DCanvas *)screen);
    iVar1 = (iVar2 - iVar1) + CleanXfac_1 * -0xe;
    local_20 = indent;
    if (iVar1 < indent) {
      local_20 = iVar1;
    }
    FString::~FString((FString *)&stack0xffffffffffffffd0);
  }
  iVar1 = FOptionMenuFieldBase::Draw
                    (&this->super_FOptionMenuFieldBase,desc,y,local_20,(bool)(text.Chars._7_1_ & 1))
  ;
  return iVar1;
}

Assistant:

int Draw(FOptionMenuDescriptor*desc, int y, int indent, bool selected)
	{
		if (mEntering)
		{
			// reposition the text so that the cursor is visible when in entering mode.
			FString text = Represent();
			int tlen = SmallFont->StringWidth(text) * CleanXfac_1;
			int newindent = screen->GetWidth() - tlen - CURSORSPACE;
			if (newindent < indent) indent = newindent;
		}
		return FOptionMenuFieldBase::Draw(desc, y, indent, selected);
	}